

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cpp
# Opt level: O2

void TestPerfomanceRandom(void)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Test Perfomance Random");
  std::endl<char,std::char_traits<char>>(poVar1);
  NoAction();
  Int2StrConvert();
  BoostLexicalCastOnStack();
  SpiritKarma();
  StdSprintf();
  StdStringStreamWithRewind();
  return;
}

Assistant:

void TestPerfomanceRandom()
{
    std::cout << "Test Perfomance Random" << std::endl;
    NoAction();
    Int2StrConvert();
#ifdef USE_BOOST
    BoostLexicalCastOnStack();
    SpiritKarma();
#endif
    StdSprintf();
    StdStringStreamWithRewind();
}